

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Appearance_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Appearance_PDU *this)

{
  byte bVar1;
  ostream *poVar2;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KUINT16 Tabs_01;
  KUINT16 Tabs_02;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString KStack_1e8;
  KString local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  LE_Header::GetAsString_abi_cxx11_(&KStack_1e8,&this->super_LE_Header);
  poVar2 = std::operator<<(local_198,(string *)&KStack_1e8);
  poVar2 = std::operator<<(poVar2,"-Appearance PDU-\n");
  poVar2 = std::operator<<(poVar2,"Optional Field Flags:\n");
  poVar2 = std::operator<<(poVar2,"\tForce ID:              ");
  DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
            (&local_1c8,(ENUMS *)(ulong)((this->m_AppearanceFlag1Union).m_ui8Flag & 1),Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tEntity Type:           ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->m_AppearanceFlag1Union).m_ui8Flag >> 1 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tAlternate Entity Type: ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->m_AppearanceFlag1Union).m_ui8Flag >> 2 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tEntity Marking:        ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->m_AppearanceFlag1Union).m_ui8Flag >> 3 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tCapabilities:          ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->m_AppearanceFlag1Union).m_ui8Flag >> 4 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tAppearance-Visual:     ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->m_AppearanceFlag1Union).m_ui8Flag >> 5 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tAppearance-IR:         ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->m_AppearanceFlag1Union).m_ui8Flag >> 6 & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tFlag2:                 ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(ushort)((this->m_AppearanceFlag1Union).m_ui8Flag >> 7));
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tAppearance-EM:         ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_AppearanceFlag2Union).m_ui8Flag & 1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tAppearance-Audio:      ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->m_AppearanceFlag2Union).m_ui8Flag >> 1 & 1);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&KStack_1e8);
  bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  if ((char)bVar1 < '\0') {
    poVar2 = std::operator<<(local_198,"\tAppearance-EM:         ");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,(this->m_AppearanceFlag2Union).m_ui8Flag & 1);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tAppearance-Audio:      ");
    poVar2 = (ostream *)
             std::ostream::operator<<(poVar2,(this->m_AppearanceFlag2Union).m_ui8Flag >> 1 & 1);
    std::operator<<(poVar2,"\n");
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 1) != 0) {
    poVar2 = std::operator<<(local_198,"Force ID:          ");
    DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
              (&KStack_1e8,(ENUMS *)(ulong)this->m_ui8ForceID,Value_00);
    poVar2 = std::operator<<(poVar2,(string *)&KStack_1e8);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&KStack_1e8);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 2) != 0) {
    poVar2 = std::operator<<(local_198,"Entity Type:         ");
    DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&KStack_1e8,&this->m_EntityType);
    std::operator<<(poVar2,(string *)&KStack_1e8);
    std::__cxx11::string::~string((string *)&KStack_1e8);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 4) != 0) {
    poVar2 = std::operator<<(local_198,"Alternate Entity Type:         ");
    DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&KStack_1e8,&this->m_AltEntityType);
    std::operator<<(poVar2,(string *)&KStack_1e8);
    std::__cxx11::string::~string((string *)&KStack_1e8);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 8) != 0) {
    DATA_TYPE::EntityMarking::GetAsString_abi_cxx11_(&KStack_1e8,&this->m_EntityMarking);
    std::operator<<(local_198,(string *)&KStack_1e8);
    std::__cxx11::string::~string((string *)&KStack_1e8);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 0x10) != 0) {
    DATA_TYPE::EntityCapabilities::GetAsString_abi_cxx11_(&KStack_1e8,&this->m_EntityCapabilities);
    std::operator<<(local_198,(string *)&KStack_1e8);
    std::__cxx11::string::~string((string *)&KStack_1e8);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 0x20) != 0) {
    poVar2 = std::operator<<(local_198,"Appearance-Visual:\n");
    DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
              (&local_1c8,&this->m_VisApp,&this->m_EntityType);
    UTILS::IndentString(&KStack_1e8,&local_1c8,Tabs,in_CL);
    std::operator<<(poVar2,(string *)&KStack_1e8);
    std::__cxx11::string::~string((string *)&KStack_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar1 & 0x40) != 0) {
    poVar2 = std::operator<<(local_198,"Appearance-IR:\n");
    DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
              (&local_1c8,&this->m_IRApp,&this->m_EntityType);
    UTILS::IndentString(&KStack_1e8,&local_1c8,Tabs_00,in_CL);
    std::operator<<(poVar2,(string *)&KStack_1e8);
    std::__cxx11::string::~string((string *)&KStack_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    bVar1 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((char)bVar1 < '\0') {
    bVar1 = (this->m_AppearanceFlag2Union).m_ui8Flag;
    if ((bVar1 & 1) != 0) {
      poVar2 = std::operator<<(local_198,"Appearance-EM:\n");
      DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
                (&local_1c8,&this->m_EMApp,&this->m_EntityType);
      UTILS::IndentString(&KStack_1e8,&local_1c8,Tabs_01,in_CL);
      std::operator<<(poVar2,(string *)&KStack_1e8);
      std::__cxx11::string::~string((string *)&KStack_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
      bVar1 = (this->m_AppearanceFlag2Union).m_ui8Flag;
    }
    if ((bVar1 & 2) != 0) {
      poVar2 = std::operator<<(local_198,"Appearance-Audio:\n");
      DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
                (&local_1c8,&this->m_AudApp,&this->m_EntityType);
      UTILS::IndentString(&KStack_1e8,&local_1c8,Tabs_02,in_CL);
      std::operator<<(poVar2,(string *)&KStack_1e8);
      std::__cxx11::string::~string((string *)&KStack_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

KString Appearance_PDU::GetAsString() const
{
    KStringStream ss;

    ss << LE_Header::GetAsString()
       << "-Appearance PDU-\n"
       << "Optional Field Flags:\n"
       << "\tForce ID:              " << GetEnumAsStringForceID( m_AppearanceFlag1Union.m_ui8ForceId ) << "\n"
       << "\tEntity Type:           " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Typ    << "\n"
       << "\tAlternate Entity Type: " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8AltTyp << "\n"
       << "\tEntity Marking:        " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Mark   << "\n"
       << "\tCapabilities:          " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Cap    << "\n"
       << "\tAppearance-Visual:     " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Vis    << "\n"
       << "\tAppearance-IR:         " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8IR     << "\n"
       << "\tFlag2:                 " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Flag2  << "\n"
       << "\tAppearance-EM:         " << ( KUINT16 )m_AppearanceFlag2Union.m_ui8EM     << "\n"
       << "\tAppearance-Audio:      " << ( KUINT16 )m_AppearanceFlag2Union.m_ui8Audio  << "\n";

    if (m_AppearanceFlag1Union.m_ui8Flag2)
    {
        ss << "\tAppearance-EM:         " << (KUINT16)m_AppearanceFlag2Union.m_ui8EM << "\n"
           << "\tAppearance-Audio:      " << (KUINT16)m_AppearanceFlag2Union.m_ui8Audio << "\n";
    }

    if( m_AppearanceFlag1Union.m_ui8ForceId )
    {
        ss << "Force ID:          " << GetEnumAsStringForceID( m_ui8ForceID ) << "\n";
    }

    if( m_AppearanceFlag1Union.m_ui8Typ )
    {
        ss << "Entity Type:         " << m_EntityType.GetAsString();
    }

    if( m_AppearanceFlag1Union.m_ui8AltTyp )
    {
        ss << "Alternate Entity Type:         " << m_AltEntityType.GetAsString();
    }

    if( m_AppearanceFlag1Union.m_ui8Mark )
    {
        ss << m_EntityMarking.GetAsString();
    }

    if( m_AppearanceFlag1Union.m_ui8Cap )
    {
        ss << m_EntityCapabilities.GetAsString();
    }

    if( m_AppearanceFlag1Union.m_ui8Vis )
    {
        ss << "Appearance-Visual:\n" << IndentString( m_VisApp.GetAsString( m_EntityType ), 1 );
    }

    if( m_AppearanceFlag1Union.m_ui8IR )
    {
        ss << "Appearance-IR:\n" << IndentString( m_IRApp.GetAsString( m_EntityType ), 1 );
    }

    if( m_AppearanceFlag1Union.m_ui8Flag2 )
    {
        if( m_AppearanceFlag2Union.m_ui8EM )
        {
            ss << "Appearance-EM:\n" << IndentString( m_EMApp.GetAsString( m_EntityType ), 1 );
        }

        if( m_AppearanceFlag2Union.m_ui8Audio )
        {
            ss << "Appearance-Audio:\n" << IndentString( m_AudApp.GetAsString( m_EntityType ), 1 );
        }
    }

    return ss.str();
}